

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcStairFlight::IfcStairFlight(IfcStairFlight *this)

{
  IfcStairFlight *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x198,"IfcStairFlight");
  IfcBuildingElement::IfcBuildingElement
            ((IfcBuildingElement *)this,&PTR_construction_vtable_24__00f96cd0);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcStairFlight,_4UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStairFlight,_4UL>,
             &PTR_construction_vtable_24__00f96e08);
  *(undefined8 *)this = 0xf96ba0;
  *(undefined8 *)&this->field_0x198 = 0xf96cb8;
  *(undefined8 *)&this->field_0x88 = 0xf96bc8;
  *(undefined8 *)&this->field_0x98 = 0xf96bf0;
  *(undefined8 *)&this->field_0xd0 = 0xf96c18;
  *(undefined8 *)&this->field_0x100 = 0xf96c40;
  *(undefined8 *)&this->field_0x138 = 0xf96c68;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStairFlight,_4UL>)._vptr_ObjectHelper =
       (_func_int **)0xf96c90;
  STEP::Maybe<long>::Maybe
            ((Maybe<long> *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStairFlight,_4UL>).field_0x10);
  STEP::Maybe<long>::Maybe
            ((Maybe<long> *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStairFlight,_4UL>).field_0x20);
  STEP::Maybe<double>::Maybe(&this->RiserHeight);
  STEP::Maybe<double>::Maybe(&this->TreadLength);
  return;
}

Assistant:

IfcStairFlight() : Object("IfcStairFlight") {}